

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

Namespace * __thiscall flatbuffers::Parser::UniqueNamespace(Parser *this,Namespace *ns)

{
  bool bVar1;
  pointer ppNVar2;
  pointer ppNVar3;
  Namespace *ns_local;
  
  ppNVar3 = &ns_local;
  ppNVar2 = (this->namespaces_).
            super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ns_local = ns;
  do {
    if (ppNVar2 ==
        (this->namespaces_).
        super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::push_back
                (&this->namespaces_,&ns_local);
LAB_00111720:
      return *ppNVar3;
    }
    bVar1 = std::operator==(&ns->components,&(*ppNVar2)->components);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ns->components);
      operator_delete(ns,0x20);
      ppNVar3 = ppNVar2;
      goto LAB_00111720;
    }
    ppNVar2 = ppNVar2 + 1;
  } while( true );
}

Assistant:

Namespace *Parser::UniqueNamespace(Namespace *ns) {
  for (auto it = namespaces_.begin(); it != namespaces_.end(); ++it) {
    if (ns->components == (*it)->components) {
      delete ns;
      return *it;
    }
  }
  namespaces_.push_back(ns);
  return ns;
}